

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddTable.c
# Opt level: O2

int cuddInsertSubtables(DdManager *unique,int n,int level)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  uint value;
  uint uVar3;
  DdSubtable *pDVar4;
  int *piVar5;
  DdNode *T;
  MtrNode *treenode;
  void *__ptr;
  undefined8 uVar6;
  int iVar7;
  long lVar8;
  DdSubtable *pDVar9;
  DdSubtable *pDVar10;
  DdSubtable *__ptr_00;
  DdSubtable *pDVar11;
  unsigned_long uVar12;
  DdNode **ppDVar13;
  DdNode *pDVar14;
  int iVar15;
  ulong uVar16;
  ulong uVar17;
  ulong uVar18;
  ulong uVar19;
  long lVar20;
  long lVar21;
  long lVar22;
  long lVar23;
  long lVar24;
  size_t __size;
  int *local_60;
  
  value = unique->initSlots;
  uVar17 = (ulong)value;
  uVar3 = unique->size;
  iVar7 = unique->maxSize;
  lVar22 = (long)(int)uVar3;
  iVar15 = uVar3 + n;
  lVar23 = (long)level;
  lVar21 = (long)n;
  lVar8 = (long)iVar15;
  if (iVar7 < iVar15) {
    iVar15 = iVar15 + 10;
    lVar24 = (long)iVar15;
    pDVar9 = (DdSubtable *)malloc(lVar24 * 0x38);
    if (pDVar9 == (DdSubtable *)0x0) {
LAB_0066dd2b:
      unique->errorCode = CUDD_MEMORY_OUT;
    }
    else {
      pDVar10 = (DdSubtable *)malloc(lVar24 * 8);
      if (pDVar10 == (DdSubtable *)0x0) {
        unique->errorCode = CUDD_MEMORY_OUT;
      }
      else {
        __size = lVar24 << 2;
        __ptr_00 = (DdSubtable *)malloc(__size);
        if (__ptr_00 == (DdSubtable *)0x0) {
          unique->errorCode = CUDD_MEMORY_OUT;
          free(pDVar9);
          pDVar9 = pDVar10;
        }
        else {
          pDVar11 = (DdSubtable *)malloc(__size);
          if (pDVar11 != (DdSubtable *)0x0) {
            if (unique->map == (int *)0x0) {
              uVar12 = unique->memused;
              lVar24 = (long)(iVar15 - iVar7);
              local_60 = (int *)0x0;
            }
            else {
              local_60 = (int *)malloc(__size);
              if (local_60 == (int *)0x0) {
                unique->errorCode = CUDD_MEMORY_OUT;
                free(pDVar9);
                free(pDVar10);
                free(__ptr_00);
                pDVar9 = pDVar11;
                goto LAB_0066ded0;
              }
              lVar24 = (long)(iVar15 - iVar7);
              uVar12 = lVar24 * 4 + unique->memused;
            }
            unique->memused = ((ulong)(value + 1) * 8 + 0x40) * lVar24 + uVar12;
            lVar24 = 0;
            uVar18 = 0;
            if (0 < level) {
              uVar18 = (ulong)(uint)level;
            }
            for (lVar20 = 0; uVar18 * 4 != lVar20; lVar20 = lVar20 + 4) {
              pDVar4 = unique->subtables;
              puVar1 = (undefined8 *)((long)&pDVar4->shift + lVar24);
              uVar6 = puVar1[1];
              puVar2 = (undefined8 *)((long)&pDVar9->shift + lVar24);
              *puVar2 = *puVar1;
              puVar2[1] = uVar6;
              *(undefined4 *)((long)&pDVar9->dead + lVar24) =
                   *(undefined4 *)((long)&pDVar4->dead + lVar24);
              *(undefined8 *)((long)&pDVar9->nodelist + lVar24) =
                   *(undefined8 *)((long)&pDVar4->nodelist + lVar24);
              puVar1 = (undefined8 *)((long)&pDVar4->bindVar + lVar24);
              uVar6 = puVar1[1];
              puVar2 = (undefined8 *)((long)&pDVar9->bindVar + lVar24);
              *puVar2 = *puVar1;
              puVar2[1] = uVar6;
              *(undefined4 *)((long)&pDVar9->varToBeGrouped + lVar24) =
                   *(undefined4 *)((long)&pDVar4->varToBeGrouped + lVar24);
              *(undefined8 *)((long)&pDVar10->nodelist + lVar20 * 2) =
                   *(undefined8 *)((long)unique->vars + lVar20 * 2);
              *(undefined4 *)((long)&__ptr_00->nodelist + lVar20) =
                   *(undefined4 *)((long)unique->perm + lVar20);
              *(undefined4 *)((long)&pDVar11->nodelist + lVar20) =
                   *(undefined4 *)((long)unique->invperm + lVar20);
              lVar24 = lVar24 + 0x38;
            }
            lVar20 = (long)level;
            for (lVar24 = lVar20; lVar24 < lVar22; lVar24 = lVar24 + 1) {
              *(int *)((long)&__ptr_00->nodelist + lVar24 * 4) = unique->perm[lVar24];
            }
            for (lVar24 = lVar20; lVar24 < level + n; lVar24 = lVar24 + 1) {
              pDVar9[lVar24].slots = value;
              iVar7 = cuddComputeFloorLog2(value);
              pDVar9[lVar24].shift = 0x20 - iVar7;
              pDVar9[lVar24].keys = 0;
              pDVar9[lVar24].maxKeys = value * 4;
              pDVar9[lVar24].dead = 0;
              iVar7 = (uVar3 - level) + (int)lVar24;
              pDVar9[lVar24].varToBeGrouped = CUDD_LAZY_NONE;
              pDVar4 = pDVar9 + lVar24;
              pDVar4->bindVar = 0;
              pDVar4->varType = CUDD_VAR_PRIMARY_INPUT;
              *(undefined8 *)(&pDVar4->bindVar + 2) = 0;
              *(int *)((long)&__ptr_00->nodelist + (long)iVar7 * 4) = (int)lVar24;
              *(int *)((long)&pDVar11->nodelist + lVar24 * 4) = iVar7;
              ppDVar13 = (DdNode **)malloc(uVar17 * 8);
              pDVar9[lVar24].nodelist = ppDVar13;
              if (ppDVar13 == (DdNode **)0x0) goto LAB_0066dd2b;
              for (uVar18 = 0; uVar17 != uVar18; uVar18 = uVar18 + 1) {
                ppDVar13[uVar18] = &unique->sentinel;
              }
            }
            lVar24 = lVar20 * 0x38;
            for (; lVar20 < lVar22; lVar20 = lVar20 + 1) {
              pDVar4 = unique->subtables;
              puVar1 = (undefined8 *)((long)&pDVar4->shift + lVar24);
              uVar6 = puVar1[1];
              puVar2 = (undefined8 *)((long)&pDVar9[lVar21].shift + lVar24);
              *puVar2 = *puVar1;
              puVar2[1] = uVar6;
              *(undefined4 *)((long)&pDVar9[lVar21].dead + lVar24) =
                   *(undefined4 *)((long)&pDVar4->dead + lVar24);
              *(undefined8 *)((long)&pDVar9[lVar21].nodelist + lVar24) =
                   *(undefined8 *)((long)&pDVar4->nodelist + lVar24);
              puVar1 = (undefined8 *)((long)&pDVar4->bindVar + lVar24);
              uVar6 = puVar1[1];
              puVar2 = (undefined8 *)((long)&pDVar9[lVar21].bindVar + lVar24);
              *puVar2 = *puVar1;
              puVar2[1] = uVar6;
              *(undefined4 *)((long)&pDVar9[lVar21].varToBeGrouped + lVar24) =
                   *(undefined4 *)((long)&pDVar4->varToBeGrouped + lVar24);
              (&pDVar10->nodelist)[lVar20] = (DdNode **)unique->vars[lVar20];
              iVar7 = unique->invperm[lVar20];
              piVar5 = (int *)((long)&__ptr_00->nodelist + (long)iVar7 * 4);
              *piVar5 = *piVar5 + n;
              *(int *)((long)&pDVar11->nodelist + lVar20 * 4 + lVar21 * 4) = iVar7;
              lVar24 = lVar24 + 0x38;
            }
            piVar5 = unique->map;
            if (piVar5 != (int *)0x0) {
              uVar18 = 0;
              uVar17 = 0;
              if (0 < (int)uVar3) {
                uVar17 = (ulong)uVar3;
              }
              for (; lVar24 = lVar22, uVar17 != uVar18; uVar18 = uVar18 + 1) {
                local_60[uVar18] = piVar5[uVar18];
              }
              for (; lVar24 < lVar8; lVar24 = lVar24 + 1) {
                local_60[lVar24] = (int)lVar24;
              }
              free(piVar5);
              unique->map = local_60;
            }
            free(unique->subtables);
            unique->subtables = pDVar9;
            unique->maxSize = iVar15;
            free(unique->vars);
            unique->vars = (DdNode **)pDVar10;
            free(unique->perm);
            unique->perm = (int *)__ptr_00;
            free(unique->invperm);
            unique->invperm = (int *)pDVar11;
            if (unique->maxSizeZ < iVar15) {
              free(unique->stack);
              ppDVar13 = (DdNode **)malloc(lVar8 * 8 + 0x58);
              unique->stack = ppDVar13;
              if (ppDVar13 == (DdNode **)0x0) goto LAB_0066dd2b;
              *ppDVar13 = (DdNode *)0x0;
              iVar7 = unique->maxSize;
              if (unique->maxSize < unique->maxSizeZ) {
                iVar7 = unique->maxSizeZ;
              }
              unique->memused = unique->memused + (long)(iVar15 - iVar7) * 8;
            }
            goto LAB_0066dc9e;
          }
          unique->errorCode = CUDD_MEMORY_OUT;
          free(pDVar9);
          free(pDVar10);
          pDVar9 = __ptr_00;
        }
      }
LAB_0066ded0:
      free(pDVar9);
    }
LAB_0066ded5:
    iVar7 = 0;
  }
  else {
    lVar20 = lVar22 * 0xe;
    for (lVar24 = lVar22; lVar23 < lVar24; lVar24 = lVar24 + -1) {
      pDVar9 = unique->subtables;
      uVar6 = *(undefined8 *)(&pDVar9[-1].shift + lVar20 + 2);
      *(undefined8 *)(&pDVar9[lVar21 + -1].shift + lVar20) =
           *(undefined8 *)(&pDVar9[-1].shift + lVar20);
      *(undefined8 *)(&pDVar9[lVar21 + -1].shift + lVar20 + 2) = uVar6;
      (&pDVar9[lVar21 + -1].dead)[lVar20] = (&pDVar9[-1].dead)[lVar20];
      *(undefined8 *)((long)&pDVar9[lVar21 + -1].nodelist + lVar20 * 4) =
           *(undefined8 *)((long)&pDVar9[-1].nodelist + lVar20 * 4);
      uVar6 = *(undefined8 *)(&pDVar9[-1].bindVar + lVar20 + 2);
      *(undefined8 *)(&pDVar9[lVar21 + -1].bindVar + lVar20) =
           *(undefined8 *)(&pDVar9[-1].bindVar + lVar20);
      *(undefined8 *)(&pDVar9[lVar21 + -1].bindVar + lVar20 + 2) = uVar6;
      (&pDVar9[lVar21 + -1].varToBeGrouped)[lVar20] = (&pDVar9[-1].varToBeGrouped)[lVar20];
      iVar7 = unique->invperm[lVar24 + -1];
      unique->invperm[lVar24 + lVar21 + -1] = iVar7;
      unique->perm[iVar7] = unique->perm[iVar7] + n;
      lVar20 = lVar20 + -0xe;
    }
    uVar19 = 0;
    uVar18 = 0;
    if (0 < n) {
      uVar18 = (ulong)(uint)n;
    }
    for (; uVar19 != uVar18; uVar19 = uVar19 + 1) {
      lVar24 = uVar19 + lVar23;
      unique->subtables[lVar24].slots = value;
      iVar7 = cuddComputeFloorLog2(value);
      pDVar9 = unique->subtables;
      pDVar9[lVar24].shift = 0x20 - iVar7;
      pDVar9[lVar24].keys = 0;
      pDVar9[lVar24].maxKeys = value * 4;
      pDVar9[lVar24].dead = 0;
      pDVar10 = pDVar9 + lVar24;
      pDVar10->bindVar = 0;
      pDVar10->varType = CUDD_VAR_PRIMARY_INPUT;
      *(undefined8 *)(&pDVar10->bindVar + 2) = 0;
      pDVar9[lVar24].varToBeGrouped = CUDD_LAZY_NONE;
      unique->perm[lVar22 + uVar19] = (int)lVar24;
      unique->invperm[lVar24] = (int)(lVar22 + uVar19);
      ppDVar13 = (DdNode **)malloc(uVar17 * 8);
      pDVar9[lVar24].nodelist = ppDVar13;
      if (ppDVar13 == (DdNode **)0x0) goto LAB_0066dd2b;
      for (uVar16 = 0; uVar17 != uVar16; uVar16 = uVar16 + 1) {
        ppDVar13[uVar16] = &unique->sentinel;
      }
    }
    piVar5 = unique->map;
    if (piVar5 != (int *)0x0) {
      for (uVar17 = 0; uVar18 != uVar17; uVar17 = uVar17 + 1) {
        piVar5[lVar22 + uVar17] = uVar3 + (int)uVar17;
      }
    }
LAB_0066dc9e:
    unique->slots = unique->slots + value * n;
    ddFixLimits(unique);
    unique->size = unique->size + n;
    T = unique->one;
    iVar7 = unique->autoDyn;
    unique->autoDyn = 0;
    lVar20 = lVar22 << 0x20;
    lVar24 = lVar22;
LAB_0066dce0:
    if (lVar24 < lVar8) {
      pDVar14 = cuddUniqueInter(unique,(int)lVar24,T,(DdNode *)((ulong)T ^ 1));
      unique->vars[lVar24] = pDVar14;
      if (unique->vars[lVar24] != (DdNode *)0x0) goto code_r0x0066dd12;
      unique->autoDyn = iVar7;
      for (lVar8 = lVar22; lVar8 < lVar20 >> 0x20; lVar8 = lVar8 + 1) {
        Cudd_IterDerefBdd(unique,unique->vars[lVar8]);
        ppDVar13 = unique->vars;
        ppDVar13[lVar8]->next = unique->nextFree;
        unique->nextFree = ppDVar13[lVar8];
        ppDVar13[lVar8] = (DdNode *)0x0;
      }
      lVar8 = lVar23 * 0x38;
      for (; lVar23 < lVar22; lVar23 = lVar23 + 1) {
        pDVar9 = unique->subtables;
        puVar1 = (undefined8 *)((long)&pDVar9[lVar21].shift + lVar8);
        uVar6 = puVar1[1];
        puVar2 = (undefined8 *)((long)&pDVar9->shift + lVar8);
        *puVar2 = *puVar1;
        puVar2[1] = uVar6;
        *(undefined4 *)((long)&pDVar9->dead + lVar8) =
             *(undefined4 *)((long)&pDVar9[lVar21].dead + lVar8);
        __ptr = *(void **)((long)&pDVar9->nodelist + lVar8);
        if (__ptr != (void *)0x0) {
          free(__ptr);
          pDVar9 = unique->subtables;
          *(undefined8 *)((long)&pDVar9->nodelist + lVar8) = 0;
        }
        *(undefined8 *)((long)&pDVar9->nodelist + lVar8) =
             *(undefined8 *)((long)&pDVar9[lVar21].nodelist + lVar8);
        *(undefined8 *)((long)&pDVar9[lVar21].nodelist + lVar8) = 0;
        puVar1 = (undefined8 *)((long)&pDVar9[lVar21].bindVar + lVar8);
        uVar6 = puVar1[1];
        puVar2 = (undefined8 *)((long)&pDVar9->bindVar + lVar8);
        *puVar2 = *puVar1;
        puVar2[1] = uVar6;
        *(undefined4 *)((long)&pDVar9->varToBeGrouped + lVar8) =
             *(undefined4 *)((long)&pDVar9[lVar21].varToBeGrouped + lVar8);
        iVar7 = unique->invperm[lVar23 + lVar21];
        unique->invperm[lVar23] = iVar7;
        unique->perm[iVar7] = unique->perm[iVar7] - n;
        lVar8 = lVar8 + 0x38;
      }
      unique->size = uVar3;
      unique->slots = unique->slots - value * n;
      ddFixLimits(unique);
      Cudd_DebugCheck(unique);
      goto LAB_0066ded5;
    }
    treenode = unique->tree;
    if (treenode != (MtrNode *)0x0) {
      treenode->size = treenode->size + n;
      treenode->index = *unique->invperm;
      ddPatchTree(unique,treenode);
    }
    unique->autoDyn = iVar7;
    iVar7 = 1;
  }
  return iVar7;
code_r0x0066dd12:
  piVar5 = (int *)(((ulong)unique->vars[lVar24] & 0xfffffffffffffffe) + 4);
  *piVar5 = *piVar5 + 1;
  lVar24 = lVar24 + 1;
  lVar20 = lVar20 + 0x100000000;
  goto LAB_0066dce0;
}

Assistant:

int
cuddInsertSubtables(
  DdManager * unique,
  int  n,
  int  level)
{
    DdSubtable *newsubtables;
    DdNodePtr *newnodelist;
    DdNodePtr *newvars;
    DdNode *sentinel = &(unique->sentinel);
    int oldsize,newsize;
    int i,j,index,reorderSave;
    unsigned int numSlots = unique->initSlots;
    int *newperm, *newinvperm, *newmap=NULL;
    DdNode *one, *zero;

#ifdef DD_DEBUG
    assert(n > 0 && level < unique->size);
#endif

    oldsize = unique->size;
    /* Easy case: there is still room in the current table. */
    if (oldsize + n <= unique->maxSize) {
        /* Shift the tables at and below level. */
        for (i = oldsize - 1; i >= level; i--) {
            unique->subtables[i+n].slots    = unique->subtables[i].slots;
            unique->subtables[i+n].shift    = unique->subtables[i].shift;
            unique->subtables[i+n].keys     = unique->subtables[i].keys;
            unique->subtables[i+n].maxKeys  = unique->subtables[i].maxKeys;
            unique->subtables[i+n].dead     = unique->subtables[i].dead;
            unique->subtables[i+n].nodelist = unique->subtables[i].nodelist;
            unique->subtables[i+n].bindVar  = unique->subtables[i].bindVar;
            unique->subtables[i+n].varType  = unique->subtables[i].varType;
            unique->subtables[i+n].pairIndex  = unique->subtables[i].pairIndex;
            unique->subtables[i+n].varHandled = unique->subtables[i].varHandled;
            unique->subtables[i+n].varToBeGrouped =
                unique->subtables[i].varToBeGrouped;

            index                           = unique->invperm[i];
            unique->invperm[i+n]            = index;
            unique->perm[index]            += n;
        }
        /* Create new subtables. */
        for (i = 0; i < n; i++) {
            unique->subtables[level+i].slots = numSlots;
            unique->subtables[level+i].shift = sizeof(int) * 8 -
                cuddComputeFloorLog2(numSlots);
            unique->subtables[level+i].keys = 0;
            unique->subtables[level+i].maxKeys = numSlots * DD_MAX_SUBTABLE_DENSITY;
            unique->subtables[level+i].dead = 0;
            unique->subtables[level+i].bindVar = 0;
            unique->subtables[level+i].varType = CUDD_VAR_PRIMARY_INPUT;
            unique->subtables[level+i].pairIndex = 0;
            unique->subtables[level+i].varHandled = 0;
            unique->subtables[level+i].varToBeGrouped = CUDD_LAZY_NONE;

            unique->perm[oldsize+i] = level + i;
            unique->invperm[level+i] = oldsize + i;
            newnodelist = unique->subtables[level+i].nodelist =
                ABC_ALLOC(DdNodePtr, numSlots);
            if (newnodelist == NULL) {
                unique->errorCode = CUDD_MEMORY_OUT;
                return(0);
            }
            for (j = 0; (unsigned) j < numSlots; j++) {
                newnodelist[j] = sentinel;
            }
        }
        if (unique->map != NULL) {
            for (i = 0; i < n; i++) {
                unique->map[oldsize+i] = oldsize + i;
            }
        }
    } else {
        /* The current table is too small: we need to allocate a new,
        ** larger one; move all old subtables, and initialize the new
        ** subtables.
        */
        newsize = oldsize + n + DD_DEFAULT_RESIZE;
#ifdef DD_VERBOSE
        (void) fprintf(unique->err,
                       "Increasing the table size from %d to %d\n",
            unique->maxSize, newsize);
#endif
        /* Allocate memory for new arrays (except nodelists). */
        newsubtables = ABC_ALLOC(DdSubtable,newsize);
        if (newsubtables == NULL) {
            unique->errorCode = CUDD_MEMORY_OUT;
            return(0);
        }
        newvars = ABC_ALLOC(DdNodePtr,newsize);
        if (newvars == NULL) {
            unique->errorCode = CUDD_MEMORY_OUT;
            ABC_FREE(newsubtables);
            return(0);
        }
        newperm = ABC_ALLOC(int,newsize);
        if (newperm == NULL) {
            unique->errorCode = CUDD_MEMORY_OUT;
            ABC_FREE(newsubtables);
            ABC_FREE(newvars);
            return(0);
        }
        newinvperm = ABC_ALLOC(int,newsize);
        if (newinvperm == NULL) {
            unique->errorCode = CUDD_MEMORY_OUT;
            ABC_FREE(newsubtables);
            ABC_FREE(newvars);
            ABC_FREE(newperm);
            return(0);
        }
        if (unique->map != NULL) {
            newmap = ABC_ALLOC(int,newsize);
            if (newmap == NULL) {
                unique->errorCode = CUDD_MEMORY_OUT;
                ABC_FREE(newsubtables);
                ABC_FREE(newvars);
                ABC_FREE(newperm);
                ABC_FREE(newinvperm);
                return(0);
            }
            unique->memused += (newsize - unique->maxSize) * sizeof(int);
        }
        unique->memused += (newsize - unique->maxSize) * ((numSlots+1) *
            sizeof(DdNode *) + 2 * sizeof(int) + sizeof(DdSubtable));
        /* Copy levels before insertion points from old tables. */
        for (i = 0; i < level; i++) {
            newsubtables[i].slots = unique->subtables[i].slots;
            newsubtables[i].shift = unique->subtables[i].shift;
            newsubtables[i].keys = unique->subtables[i].keys;
            newsubtables[i].maxKeys = unique->subtables[i].maxKeys;
            newsubtables[i].dead = unique->subtables[i].dead;
            newsubtables[i].nodelist = unique->subtables[i].nodelist;
            newsubtables[i].bindVar = unique->subtables[i].bindVar;
            newsubtables[i].varType = unique->subtables[i].varType;
            newsubtables[i].pairIndex = unique->subtables[i].pairIndex;
            newsubtables[i].varHandled = unique->subtables[i].varHandled;
            newsubtables[i].varToBeGrouped = unique->subtables[i].varToBeGrouped;

            newvars[i] = unique->vars[i];
            newperm[i] = unique->perm[i];
            newinvperm[i] = unique->invperm[i];
        }
        /* Finish initializing permutation for new table to old one. */
        for (i = level; i < oldsize; i++) {
            newperm[i] = unique->perm[i];
        }
        /* Initialize new levels. */
        for (i = level; i < level + n; i++) {
            newsubtables[i].slots = numSlots;
            newsubtables[i].shift = sizeof(int) * 8 -
                cuddComputeFloorLog2(numSlots);
            newsubtables[i].keys = 0;
            newsubtables[i].maxKeys = numSlots * DD_MAX_SUBTABLE_DENSITY;
            newsubtables[i].dead = 0;
            newsubtables[i].bindVar = 0;
            newsubtables[i].varType = CUDD_VAR_PRIMARY_INPUT;
            newsubtables[i].pairIndex = 0;
            newsubtables[i].varHandled = 0;
            newsubtables[i].varToBeGrouped = CUDD_LAZY_NONE;

            newperm[oldsize + i - level] = i;
            newinvperm[i] = oldsize + i - level;
            newnodelist = newsubtables[i].nodelist = ABC_ALLOC(DdNodePtr, numSlots);
            if (newnodelist == NULL) {
                /* We are going to leak some memory.  We should clean up. */
                unique->errorCode = CUDD_MEMORY_OUT;
                return(0);
            }
            for (j = 0; (unsigned) j < numSlots; j++) {
                newnodelist[j] = sentinel;
            }
        }
        /* Copy the old tables for levels past the insertion point. */
        for (i = level; i < oldsize; i++) {
            newsubtables[i+n].slots    = unique->subtables[i].slots;
            newsubtables[i+n].shift    = unique->subtables[i].shift;
            newsubtables[i+n].keys     = unique->subtables[i].keys;
            newsubtables[i+n].maxKeys  = unique->subtables[i].maxKeys;
            newsubtables[i+n].dead     = unique->subtables[i].dead;
            newsubtables[i+n].nodelist = unique->subtables[i].nodelist;
            newsubtables[i+n].bindVar  = unique->subtables[i].bindVar;
            newsubtables[i+n].varType  = unique->subtables[i].varType;
            newsubtables[i+n].pairIndex  = unique->subtables[i].pairIndex;
            newsubtables[i+n].varHandled  = unique->subtables[i].varHandled;
            newsubtables[i+n].varToBeGrouped  =
                unique->subtables[i].varToBeGrouped;

            newvars[i]                 = unique->vars[i];
            index                      = unique->invperm[i];
            newinvperm[i+n]            = index;
            newperm[index]            += n;
        }
        /* Update the map. */
        if (unique->map != NULL) {
            for (i = 0; i < oldsize; i++) {
                newmap[i] = unique->map[i];
            }
            for (i = oldsize; i < oldsize + n; i++) {
                newmap[i] = i;
            }
            ABC_FREE(unique->map);
            unique->map = newmap;
        }
        /* Install the new tables and free the old ones. */
        ABC_FREE(unique->subtables);
        unique->subtables = newsubtables;
        unique->maxSize = newsize;
        ABC_FREE(unique->vars);
        unique->vars = newvars;
        ABC_FREE(unique->perm);
        unique->perm = newperm;
        ABC_FREE(unique->invperm);
        unique->invperm = newinvperm;
        /* Update the stack for iterative procedures. */
        if (newsize > unique->maxSizeZ) {
            ABC_FREE(unique->stack);
            unique->stack = ABC_ALLOC(DdNodePtr,newsize + 1);
            if (unique->stack == NULL) {
                unique->errorCode = CUDD_MEMORY_OUT;
                return(0);
            }
            unique->stack[0] = NULL; /* to suppress harmless UMR */
            unique->memused +=
                (newsize - ddMax(unique->maxSize,unique->maxSizeZ))
                * sizeof(DdNode *);
        }
    }
    /* Update manager parameters to account for the new subtables. */
    unique->slots += n * numSlots;
    ddFixLimits(unique);
    unique->size += n;

    /* Now that the table is in a coherent state, create the new
    ** projection functions. We need to temporarily disable reordering,
    ** because we cannot reorder without projection functions in place.
    **/
    one = unique->one;
    zero = Cudd_Not(one);

    reorderSave = unique->autoDyn;
    unique->autoDyn = 0;
    for (i = oldsize; i < oldsize + n; i++) {
        unique->vars[i] = cuddUniqueInter(unique,i,one,zero);
        if (unique->vars[i] == NULL) {
            unique->autoDyn = reorderSave;
            /* Shift everything back so table remains coherent. */
            for (j = oldsize; j < i; j++) {
                Cudd_IterDerefBdd(unique,unique->vars[j]);
                cuddDeallocNode(unique,unique->vars[j]);
                unique->vars[j] = NULL;
            }
            for (j = level; j < oldsize; j++) {
                unique->subtables[j].slots    = unique->subtables[j+n].slots;
                unique->subtables[j].slots    = unique->subtables[j+n].slots;
                unique->subtables[j].shift    = unique->subtables[j+n].shift;
                unique->subtables[j].keys     = unique->subtables[j+n].keys;
                unique->subtables[j].maxKeys  =
                    unique->subtables[j+n].maxKeys;
                unique->subtables[j].dead     = unique->subtables[j+n].dead;
                ABC_FREE(unique->subtables[j].nodelist);
                unique->subtables[j].nodelist =
                    unique->subtables[j+n].nodelist;
                unique->subtables[j+n].nodelist = NULL;
                unique->subtables[j].bindVar  =
                    unique->subtables[j+n].bindVar;
                unique->subtables[j].varType  =
                    unique->subtables[j+n].varType;
                unique->subtables[j].pairIndex =
                    unique->subtables[j+n].pairIndex;
                unique->subtables[j].varHandled =
                    unique->subtables[j+n].varHandled;
                unique->subtables[j].varToBeGrouped =
                    unique->subtables[j+n].varToBeGrouped;
                index                         = unique->invperm[j+n];
                unique->invperm[j]            = index;
                unique->perm[index]          -= n;
            }
            unique->size = oldsize;
            unique->slots -= n * numSlots;
            ddFixLimits(unique);
            (void) Cudd_DebugCheck(unique);
            return(0);
        }
        cuddRef(unique->vars[i]);
    }
    if (unique->tree != NULL) {
        unique->tree->size += n;
        unique->tree->index = unique->invperm[0];
        ddPatchTree(unique,unique->tree);
    }
    unique->autoDyn = reorderSave;

    return(1);

}